

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cGPUShader5Tests.cpp
# Opt level: O2

void __thiscall
gl3cts::Utils::programInfo::setUniform
          (programInfo *this,_variable_type type,GLchar *name,GLvoid *data)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  TestError *this_00;
  long lVar3;
  
  iVar1 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  iVar1 = (**(code **)(lVar3 + 0xb48))(this->m_program_object_id,name);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glGetUniformLocation() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cGPUShader5Tests.cpp"
                  ,0xfb);
  if (iVar1 == -1) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Uniform variable is unavailable",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cGPUShader5Tests.cpp"
               ,0xff);
  }
  else {
    if (type < VARIABLE_TYPE_UNKNOWN) {
      (**(code **)(lVar3 + *(long *)(&DAT_01643930 + (ulong)type * 8)))(iVar1,1,data);
      dVar2 = (**(code **)(lVar3 + 0x800))();
      glu::checkError(dVar2,"Uniform",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cGPUShader5Tests.cpp"
                      ,0x12e);
      return;
    }
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cGPUShader5Tests.cpp"
               ,0x12a);
  }
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void Utils::programInfo::setUniform(Utils::_variable_type type, const glw::GLchar* name, const glw::GLvoid* data)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	const glw::GLfloat* f_data = (glw::GLfloat*)data;
	const glw::GLint*   i_data = (glw::GLint*)data;
	const glw::GLuint*  u_data = (glw::GLuint*)data;

	/* Get location */
	glw::GLint location = gl.getUniformLocation(m_program_object_id, name);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetUniformLocation() call failed.");

	if (-1 == location)
	{
		TCU_FAIL("Uniform variable is unavailable");
	}

	/* Set data */
	switch (type)
	{
	case Utils::VARIABLE_TYPE_FLOAT:
		gl.uniform1fv(location, 1, f_data);
		break;
	case Utils::VARIABLE_TYPE_INT:
		gl.uniform1iv(location, 1, i_data);
		break;
	case Utils::VARIABLE_TYPE_IVEC2:
		gl.uniform2iv(location, 1, i_data);
		break;
	case Utils::VARIABLE_TYPE_IVEC3:
		gl.uniform3iv(location, 1, i_data);
		break;
	case Utils::VARIABLE_TYPE_IVEC4:
		gl.uniform4iv(location, 1, i_data);
		break;
	case Utils::VARIABLE_TYPE_UINT:
		gl.uniform1uiv(location, 1, u_data);
		break;
	case Utils::VARIABLE_TYPE_UVEC2:
		gl.uniform2uiv(location, 1, u_data);
		break;
	case Utils::VARIABLE_TYPE_UVEC3:
		gl.uniform3uiv(location, 1, u_data);
		break;
	case Utils::VARIABLE_TYPE_UVEC4:
		gl.uniform4uiv(location, 1, u_data);
		break;
	case Utils::VARIABLE_TYPE_VEC2:
		gl.uniform2fv(location, 1, f_data);
		break;
	case Utils::VARIABLE_TYPE_VEC3:
		gl.uniform3fv(location, 1, f_data);
		break;
	case Utils::VARIABLE_TYPE_VEC4:
		gl.uniform4fv(location, 1, f_data);
		break;
	default:
		TCU_FAIL("Invalid enum");
		break;
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "Uniform");
}